

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_heap_remove(extent_heap_t *ph,extent_t *phn)

{
  void *pvVar1;
  void *pvVar2;
  extent_t *peVar3;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t **ppeVar6;
  extent_t *peVar7;
  extent_t *peVar8;
  extent_t *peVar9;
  extent_t *peVar10;
  uintptr_t a_addr_1;
  int iVar11;
  uintptr_t a_addr_3;
  uintptr_t a_addr_7;
  ulong uVar12;
  uintptr_t a_addr;
  ulong uVar13;
  uintptr_t a_addr_8;
  
  peVar7 = ph->ph_root;
  if (peVar7 == phn) {
    if ((phn->ph_link).phn_lchild == (extent_t *)0x0) {
      peVar7 = (phn->ph_link).phn_next;
      ph->ph_root = peVar7;
      if (peVar7 == (extent_t *)0x0) {
        return;
      }
      (peVar7->ph_link).phn_prev = (extent_t *)0x0;
      return;
    }
    peVar10 = (peVar7->ph_link).phn_next;
    if (peVar10 != (extent_t *)0x0) {
      (peVar7->ph_link).phn_prev = (extent_t *)0x0;
      (peVar7->ph_link).phn_next = (extent_t *)0x0;
      (peVar10->ph_link).phn_prev = (extent_t *)0x0;
      peVar5 = (peVar10->ph_link).phn_next;
      if (peVar5 == (extent_t *)0x0) {
LAB_0012ad57:
        uVar12 = peVar7->e_bits >> 0x2a;
        uVar13 = peVar10->e_bits >> 0x2a;
        iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
        if (iVar11 == 0) {
          pvVar1 = peVar7->e_addr;
          pvVar2 = peVar10->e_addr;
          iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
        }
        if (iVar11 < 0) {
          (peVar10->ph_link).phn_prev = peVar7;
          peVar5 = (peVar7->ph_link).phn_lchild;
          (peVar10->ph_link).phn_next = peVar5;
          if (peVar5 != (extent_t *)0x0) {
            (peVar5->ph_link).phn_prev = peVar10;
          }
          (peVar7->ph_link).phn_lchild = peVar10;
          goto LAB_0012adc0;
        }
        (peVar7->ph_link).phn_prev = peVar10;
        peVar5 = (peVar10->ph_link).phn_lchild;
        (peVar7->ph_link).phn_next = peVar5;
        if (peVar5 != (extent_t *)0x0) {
          (peVar5->ph_link).phn_prev = peVar7;
        }
        (peVar10->ph_link).phn_lchild = peVar7;
      }
      else {
        peVar8 = (peVar5->ph_link).phn_next;
        if (peVar8 != (extent_t *)0x0) {
          (peVar8->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar10->ph_link).phn_prev = (extent_t *)0x0;
        (peVar10->ph_link).phn_next = (extent_t *)0x0;
        (peVar5->ph_link).phn_prev = (extent_t *)0x0;
        (peVar5->ph_link).phn_next = (extent_t *)0x0;
        uVar12 = peVar10->e_bits >> 0x2a;
        uVar13 = peVar5->e_bits >> 0x2a;
        iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
        if (iVar11 == 0) {
          pvVar1 = peVar10->e_addr;
          pvVar2 = peVar5->e_addr;
          iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
        }
        if (iVar11 < 0) {
          (peVar5->ph_link).phn_prev = peVar10;
          peVar9 = (peVar10->ph_link).phn_lchild;
          (peVar5->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar5;
          }
          (peVar10->ph_link).phn_lchild = peVar5;
          peVar5 = peVar10;
        }
        else {
          (peVar10->ph_link).phn_prev = peVar5;
          peVar9 = (peVar5->ph_link).phn_lchild;
          (peVar10->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar10;
          }
          (peVar5->ph_link).phn_lchild = peVar10;
          peVar10 = peVar5;
        }
        while (peVar9 = peVar8, peVar9 != (extent_t *)0x0) {
          peVar3 = (peVar9->ph_link).phn_next;
          if (peVar3 == (extent_t *)0x0) {
            (peVar5->ph_link).phn_next = peVar9;
            peVar5 = peVar9;
            break;
          }
          peVar8 = (peVar3->ph_link).phn_next;
          if (peVar8 != (extent_t *)0x0) {
            (peVar8->ph_link).phn_prev = (extent_t *)0x0;
          }
          (peVar9->ph_link).phn_prev = (extent_t *)0x0;
          (peVar9->ph_link).phn_next = (extent_t *)0x0;
          (peVar3->ph_link).phn_prev = (extent_t *)0x0;
          (peVar3->ph_link).phn_next = (extent_t *)0x0;
          uVar12 = peVar9->e_bits >> 0x2a;
          uVar13 = peVar3->e_bits >> 0x2a;
          iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
          if (iVar11 == 0) {
            pvVar1 = peVar9->e_addr;
            pvVar2 = peVar3->e_addr;
            iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
          }
          if (iVar11 < 0) {
            (peVar3->ph_link).phn_prev = peVar9;
            peVar4 = (peVar9->ph_link).phn_lchild;
            (peVar3->ph_link).phn_next = peVar4;
            if (peVar4 != (extent_t *)0x0) {
              (peVar4->ph_link).phn_prev = peVar3;
            }
            (peVar9->ph_link).phn_lchild = peVar3;
          }
          else {
            (peVar9->ph_link).phn_prev = peVar3;
            peVar4 = (peVar3->ph_link).phn_lchild;
            (peVar9->ph_link).phn_next = peVar4;
            if (peVar4 != (extent_t *)0x0) {
              (peVar4->ph_link).phn_prev = peVar9;
            }
            (peVar3->ph_link).phn_lchild = peVar9;
            peVar9 = peVar3;
          }
          (peVar5->ph_link).phn_next = peVar9;
          peVar5 = peVar9;
        }
        peVar8 = (peVar10->ph_link).phn_next;
        peVar9 = peVar10;
        if (peVar8 != (extent_t *)0x0) {
          while( true ) {
            peVar3 = (peVar8->ph_link).phn_next;
            (peVar9->ph_link).phn_next = (extent_t *)0x0;
            (peVar8->ph_link).phn_next = (extent_t *)0x0;
            uVar12 = peVar9->e_bits >> 0x2a;
            uVar13 = peVar8->e_bits >> 0x2a;
            iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
            if (iVar11 == 0) {
              pvVar1 = peVar9->e_addr;
              pvVar2 = peVar8->e_addr;
              iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
            }
            if (iVar11 < 0) {
              (peVar8->ph_link).phn_prev = peVar9;
              peVar10 = (peVar9->ph_link).phn_lchild;
              (peVar8->ph_link).phn_next = peVar10;
              if (peVar10 != (extent_t *)0x0) {
                (peVar10->ph_link).phn_prev = peVar8;
              }
              (peVar9->ph_link).phn_lchild = peVar8;
              peVar10 = peVar9;
            }
            else {
              (peVar9->ph_link).phn_prev = peVar8;
              peVar10 = (peVar8->ph_link).phn_lchild;
              (peVar9->ph_link).phn_next = peVar10;
              if (peVar10 != (extent_t *)0x0) {
                (peVar10->ph_link).phn_prev = peVar9;
              }
              (peVar8->ph_link).phn_lchild = peVar9;
              peVar10 = peVar8;
            }
            if (peVar3 == (extent_t *)0x0) break;
            (peVar5->ph_link).phn_next = peVar10;
            peVar8 = (peVar3->ph_link).phn_next;
            peVar9 = peVar3;
            peVar5 = peVar10;
          }
        }
        if (phn != (extent_t *)0x0) goto LAB_0012ad57;
      }
      peVar7 = peVar10;
      ph->ph_root = peVar7;
    }
LAB_0012adc0:
    if (peVar7 == phn) {
      peVar7 = (peVar7->ph_link).phn_lchild;
      if (peVar7 == (extent_t *)0x0) {
        peVar7 = (extent_t *)0x0;
      }
      else {
        peVar10 = (peVar7->ph_link).phn_next;
        if (peVar10 != (extent_t *)0x0) {
          peVar5 = (peVar10->ph_link).phn_next;
          if (peVar5 != (extent_t *)0x0) {
            (peVar5->ph_link).phn_prev = (extent_t *)0x0;
          }
          (peVar7->ph_link).phn_prev = (extent_t *)0x0;
          (peVar7->ph_link).phn_next = (extent_t *)0x0;
          (peVar10->ph_link).phn_prev = (extent_t *)0x0;
          (peVar10->ph_link).phn_next = (extent_t *)0x0;
          uVar12 = peVar7->e_bits >> 0x2a;
          uVar13 = peVar10->e_bits >> 0x2a;
          iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
          if (iVar11 == 0) {
            pvVar1 = peVar7->e_addr;
            pvVar2 = peVar10->e_addr;
            iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
          }
          if (iVar11 < 0) {
            (peVar10->ph_link).phn_prev = peVar7;
            peVar8 = (peVar7->ph_link).phn_lchild;
            (peVar10->ph_link).phn_next = peVar8;
            if (peVar8 != (extent_t *)0x0) {
              (peVar8->ph_link).phn_prev = peVar10;
            }
            (peVar7->ph_link).phn_lchild = peVar10;
            peVar10 = peVar7;
          }
          else {
            (peVar7->ph_link).phn_prev = peVar10;
            peVar8 = (peVar10->ph_link).phn_lchild;
            (peVar7->ph_link).phn_next = peVar8;
            if (peVar8 != (extent_t *)0x0) {
              (peVar8->ph_link).phn_prev = peVar7;
            }
            (peVar10->ph_link).phn_lchild = peVar7;
            peVar7 = peVar10;
          }
          while (peVar8 = peVar5, peVar8 != (extent_t *)0x0) {
            peVar9 = (peVar8->ph_link).phn_next;
            if (peVar9 == (extent_t *)0x0) {
              (peVar10->ph_link).phn_next = peVar8;
              peVar10 = peVar8;
              break;
            }
            peVar5 = (peVar9->ph_link).phn_next;
            if (peVar5 != (extent_t *)0x0) {
              (peVar5->ph_link).phn_prev = (extent_t *)0x0;
            }
            (peVar8->ph_link).phn_prev = (extent_t *)0x0;
            (peVar8->ph_link).phn_next = (extent_t *)0x0;
            (peVar9->ph_link).phn_prev = (extent_t *)0x0;
            (peVar9->ph_link).phn_next = (extent_t *)0x0;
            uVar12 = peVar8->e_bits >> 0x2a;
            uVar13 = peVar9->e_bits >> 0x2a;
            iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
            if (iVar11 == 0) {
              pvVar1 = peVar8->e_addr;
              pvVar2 = peVar9->e_addr;
              iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
            }
            if (iVar11 < 0) {
              (peVar9->ph_link).phn_prev = peVar8;
              peVar3 = (peVar8->ph_link).phn_lchild;
              (peVar9->ph_link).phn_next = peVar3;
              if (peVar3 != (extent_t *)0x0) {
                (peVar3->ph_link).phn_prev = peVar9;
              }
              (peVar8->ph_link).phn_lchild = peVar9;
            }
            else {
              (peVar8->ph_link).phn_prev = peVar9;
              peVar3 = (peVar9->ph_link).phn_lchild;
              (peVar8->ph_link).phn_next = peVar3;
              if (peVar3 != (extent_t *)0x0) {
                (peVar3->ph_link).phn_prev = peVar8;
              }
              (peVar9->ph_link).phn_lchild = peVar8;
              peVar8 = peVar9;
            }
            (peVar10->ph_link).phn_next = peVar8;
            peVar10 = peVar8;
          }
          peVar5 = (peVar7->ph_link).phn_next;
          peVar8 = peVar7;
          if (peVar5 != (extent_t *)0x0) {
            while( true ) {
              peVar9 = (peVar5->ph_link).phn_next;
              (peVar8->ph_link).phn_next = (extent_t *)0x0;
              (peVar5->ph_link).phn_next = (extent_t *)0x0;
              uVar12 = peVar8->e_bits >> 0x2a;
              uVar13 = peVar5->e_bits >> 0x2a;
              iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
              if (iVar11 == 0) {
                pvVar1 = peVar8->e_addr;
                pvVar2 = peVar5->e_addr;
                iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
              }
              if (iVar11 < 0) {
                (peVar5->ph_link).phn_prev = peVar8;
                peVar7 = (peVar8->ph_link).phn_lchild;
                (peVar5->ph_link).phn_next = peVar7;
                if (peVar7 != (extent_t *)0x0) {
                  (peVar7->ph_link).phn_prev = peVar5;
                }
                (peVar8->ph_link).phn_lchild = peVar5;
                peVar7 = peVar8;
              }
              else {
                (peVar8->ph_link).phn_prev = peVar5;
                peVar7 = (peVar5->ph_link).phn_lchild;
                (peVar8->ph_link).phn_next = peVar7;
                if (peVar7 != (extent_t *)0x0) {
                  (peVar7->ph_link).phn_prev = peVar8;
                }
                (peVar5->ph_link).phn_lchild = peVar8;
                peVar7 = peVar5;
              }
              if (peVar9 == (extent_t *)0x0) break;
              (peVar10->ph_link).phn_next = peVar7;
              peVar5 = (peVar9->ph_link).phn_next;
              peVar8 = peVar9;
              peVar10 = peVar7;
            }
          }
        }
      }
      ph->ph_root = peVar7;
      return;
    }
  }
  peVar7 = (phn->ph_link).phn_prev;
  if (peVar7 == (extent_t *)0x0) {
    peVar10 = (phn->ph_link).phn_lchild;
    if (peVar10 != (extent_t *)0x0) {
      peVar5 = (extent_t *)0x0;
      goto LAB_0012a94c;
    }
  }
  else {
    peVar5 = (extent_t *)0x0;
    if ((peVar7->ph_link).phn_lchild == phn) {
      peVar5 = peVar7;
    }
    peVar10 = (phn->ph_link).phn_lchild;
    if (peVar10 != (extent_t *)0x0) {
LAB_0012a94c:
      peVar7 = (peVar10->ph_link).phn_next;
      if (peVar7 != (extent_t *)0x0) {
        peVar8 = (peVar7->ph_link).phn_next;
        if (peVar8 != (extent_t *)0x0) {
          (peVar8->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar10->ph_link).phn_prev = (extent_t *)0x0;
        (peVar10->ph_link).phn_next = (extent_t *)0x0;
        (peVar7->ph_link).phn_prev = (extent_t *)0x0;
        (peVar7->ph_link).phn_next = (extent_t *)0x0;
        uVar12 = peVar10->e_bits >> 0x2a;
        uVar13 = peVar7->e_bits >> 0x2a;
        iVar11 = (uint)(uVar13 < uVar12) - (uint)(uVar12 < uVar13);
        if (iVar11 == 0) {
          pvVar1 = peVar10->e_addr;
          pvVar2 = peVar7->e_addr;
          iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
        }
        if (iVar11 < 0) {
          (peVar7->ph_link).phn_prev = peVar10;
          peVar9 = (peVar10->ph_link).phn_lchild;
          (peVar7->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar7;
          }
          (peVar10->ph_link).phn_lchild = peVar7;
          peVar7 = peVar10;
        }
        else {
          (peVar10->ph_link).phn_prev = peVar7;
          peVar9 = (peVar7->ph_link).phn_lchild;
          (peVar10->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar10;
          }
          (peVar7->ph_link).phn_lchild = peVar10;
          peVar10 = peVar7;
        }
        while (peVar9 = peVar8, peVar8 = peVar10, peVar9 != (extent_t *)0x0) {
          peVar3 = (peVar9->ph_link).phn_next;
          if (peVar3 == (extent_t *)0x0) {
            (peVar10->ph_link).phn_next = peVar9;
            peVar8 = peVar9;
            break;
          }
          peVar8 = (peVar3->ph_link).phn_next;
          if (peVar8 != (extent_t *)0x0) {
            (peVar8->ph_link).phn_prev = (extent_t *)0x0;
          }
          (peVar9->ph_link).phn_prev = (extent_t *)0x0;
          (peVar9->ph_link).phn_next = (extent_t *)0x0;
          (peVar3->ph_link).phn_prev = (extent_t *)0x0;
          (peVar3->ph_link).phn_next = (extent_t *)0x0;
          uVar13 = peVar9->e_bits >> 0x2a;
          uVar12 = peVar3->e_bits >> 0x2a;
          iVar11 = (uint)(uVar12 < uVar13) - (uint)(uVar13 < uVar12);
          if (iVar11 == 0) {
            pvVar1 = peVar9->e_addr;
            pvVar2 = peVar3->e_addr;
            iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
          }
          if (iVar11 < 0) {
            (peVar3->ph_link).phn_prev = peVar9;
            peVar4 = (peVar9->ph_link).phn_lchild;
            (peVar3->ph_link).phn_next = peVar4;
            if (peVar4 != (extent_t *)0x0) {
              (peVar4->ph_link).phn_prev = peVar3;
            }
            (peVar9->ph_link).phn_lchild = peVar3;
          }
          else {
            (peVar9->ph_link).phn_prev = peVar3;
            peVar4 = (peVar3->ph_link).phn_lchild;
            (peVar9->ph_link).phn_next = peVar4;
            if (peVar4 != (extent_t *)0x0) {
              (peVar4->ph_link).phn_prev = peVar9;
            }
            (peVar3->ph_link).phn_lchild = peVar9;
            peVar9 = peVar3;
          }
          (peVar10->ph_link).phn_next = peVar9;
          peVar10 = peVar9;
        }
        peVar9 = (peVar7->ph_link).phn_next;
        peVar10 = peVar7;
        if (peVar9 != (extent_t *)0x0) {
          while( true ) {
            peVar3 = (peVar9->ph_link).phn_next;
            (peVar7->ph_link).phn_next = (extent_t *)0x0;
            (peVar9->ph_link).phn_next = (extent_t *)0x0;
            uVar13 = peVar7->e_bits >> 0x2a;
            uVar12 = peVar9->e_bits >> 0x2a;
            iVar11 = (uint)(uVar12 < uVar13) - (uint)(uVar13 < uVar12);
            if (iVar11 == 0) {
              pvVar1 = peVar7->e_addr;
              pvVar2 = peVar9->e_addr;
              iVar11 = (uint)(pvVar1 >= pvVar2 && pvVar1 != pvVar2) - (uint)(pvVar1 < pvVar2);
            }
            if (iVar11 < 0) {
              (peVar9->ph_link).phn_prev = peVar7;
              peVar10 = (peVar7->ph_link).phn_lchild;
              (peVar9->ph_link).phn_next = peVar10;
              if (peVar10 != (extent_t *)0x0) {
                (peVar10->ph_link).phn_prev = peVar9;
              }
              (peVar7->ph_link).phn_lchild = peVar9;
              peVar10 = peVar7;
            }
            else {
              (peVar7->ph_link).phn_prev = peVar9;
              peVar10 = (peVar9->ph_link).phn_lchild;
              (peVar7->ph_link).phn_next = peVar10;
              if (peVar10 != (extent_t *)0x0) {
                (peVar10->ph_link).phn_prev = peVar7;
              }
              (peVar9->ph_link).phn_lchild = peVar7;
              peVar10 = peVar9;
            }
            if (peVar3 == (extent_t *)0x0) break;
            (peVar8->ph_link).phn_next = peVar10;
            peVar9 = (peVar3->ph_link).phn_next;
            peVar7 = peVar3;
            peVar8 = peVar10;
          }
        }
      }
      if (peVar5 == (extent_t *)0x0) {
        peVar7 = (phn->ph_link).phn_prev;
        (peVar10->ph_link).phn_prev = peVar7;
        if (peVar7 == (extent_t *)0x0) goto LAB_0012abb1;
        ppeVar6 = &(peVar7->ph_link).phn_next;
      }
      else {
        (peVar10->ph_link).phn_prev = peVar5;
        ppeVar6 = &(peVar5->ph_link).phn_lchild;
      }
      *ppeVar6 = peVar10;
LAB_0012abb1:
      peVar7 = (phn->ph_link).phn_next;
      (peVar10->ph_link).phn_next = peVar7;
      if (peVar7 == (extent_t *)0x0) {
        return;
      }
      (peVar7->ph_link).phn_prev = peVar10;
      return;
    }
    if (peVar5 != (extent_t *)0x0) {
      peVar10 = (phn->ph_link).phn_next;
      (peVar5->ph_link).phn_lchild = peVar10;
      if (peVar10 == (extent_t *)0x0) {
        return;
      }
      (peVar10->ph_link).phn_prev = peVar5;
      goto LAB_0012a9e2;
    }
  }
  peVar10 = (phn->ph_link).phn_next;
  (peVar7->ph_link).phn_next = peVar10;
  if (peVar10 == (extent_t *)0x0) {
    return;
  }
LAB_0012a9e2:
  (peVar10->ph_link).phn_prev = (phn->ph_link).phn_prev;
  return;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}